

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_tracing.cpp
# Opt level: O0

ze_result_t zelLoaderGetVersion(zel_component_version_t *version)

{
  zel_component_version_t *version_local;
  
  if (version == (zel_component_version_t *)0x0) {
    version_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    strncpy(version->component_name,"tracing layer",0x40);
    version->spec_version = ZE_API_VERSION_1_13;
    (version->component_lib_version).major = 1;
    (version->component_lib_version).minor = 0x16;
    (version->component_lib_version).patch = 0;
    version_local._4_4_ = ZE_RESULT_SUCCESS;
  }
  return version_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zelLoaderGetVersion(zel_component_version_t *version)    
{
    if(version == nullptr)
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    string_copy_s(version->component_name, TRACING_COMP_NAME, ZEL_COMPONENT_STRING_SIZE);
    version->spec_version = ZE_API_VERSION_CURRENT;
    version->component_lib_version.major = LOADER_VERSION_MAJOR;
    version->component_lib_version.minor = LOADER_VERSION_MINOR;
    version->component_lib_version.patch = LOADER_VERSION_PATCH;

    return ZE_RESULT_SUCCESS;
}